

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O2

NativeWindow * __thiscall
tcu::x11::egl::WindowFactory::createWindow
          (WindowFactory *this,NativeDisplay *nativeDisplay,EGLDisplay eglDisplay,EGLConfig config,
          EGLAttrib *attribList,WindowParams *params)

{
  uint in_EAX;
  int iVar1;
  Display *display;
  undefined4 extraout_var;
  Visual *visual;
  Window *this_00;
  uint uStack_38;
  EGLint visualID;
  
  uStack_38 = in_EAX;
  if (nativeDisplay == (NativeDisplay *)0x0) {
    display = (Display *)0x0;
  }
  else {
    display = (Display *)
              __dynamic_cast(nativeDisplay,&eglu::NativeDisplay::typeinfo,&Display::typeinfo,0);
  }
  _uStack_38 = (ulong)uStack_38;
  iVar1 = (*nativeDisplay->_vptr_NativeDisplay[2])(nativeDisplay);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 200))
            ((long *)CONCAT44(extraout_var,iVar1),eglDisplay,config,0x302e,&visualID);
  if ((long)visualID == 0) {
    visual = (Visual *)0x0;
  }
  else {
    visual = XlibDisplay::getVisual
                       ((display->m_display).
                        super_UniqueBase<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>
                        .m_data.ptr,(long)visualID);
  }
  this_00 = (Window *)operator_new(0x38);
  Window::Window(this_00,display,params,visual);
  return &this_00->super_NativeWindow;
}

Assistant:

NativeWindow* WindowFactory::createWindow (NativeDisplay*			nativeDisplay,
										   eglw::EGLDisplay			eglDisplay,
										   eglw::EGLConfig			config,
										   const eglw::EGLAttrib*	attribList,
										   const WindowParams&		params) const
{
	DE_UNREF(attribList);

	Display&		display		= *dynamic_cast<Display*>(nativeDisplay);
	eglw::EGLint	visualID	= 0;
	::Visual*		visual		= DE_NULL;
	nativeDisplay->getLibrary().getConfigAttrib(eglDisplay, config, EGL_NATIVE_VISUAL_ID, &visualID);

	if (visualID != 0)
		visual = display.getX11Display().getVisual(visualID);

	return new Window(display, params, visual);
}